

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# screenshot.c
# Opt level: O0

void next_screenshot(SCREENSHOT *ss)

{
  ulong uVar1;
  uint *in_RDI;
  char buf [64];
  char acStackY_48 [56];
  SCREENSHOT *in_stack_fffffffffffffff0;
  
  *in_RDI = *in_RDI + 1;
  if ((int)*in_RDI < 10000) {
    snprintf(acStackY_48,0x40,"%s%04d.%s",*(undefined8 *)(in_RDI + 2),(ulong)*in_RDI,
             *(undefined8 *)(in_RDI + 4));
    uVar1 = al_filename_exists(acStackY_48);
    if ((uVar1 & 1) != 0) {
      next_screenshot(in_stack_fffffffffffffff0);
    }
  }
  else {
    *in_RDI = 0;
  }
  return;
}

Assistant:

static void next_screenshot(SCREENSHOT * ss)
{
   char buf[64];

   ss->counter++;
   if (ss->counter >= 10000) {
      ss->counter = 0;
      return;
   }

   snprintf(buf, sizeof(buf), "%s%04d.%s", ss->name, ss->counter, ss->ext);
   if (al_filename_exists(buf)) {
      next_screenshot(ss);
   }
}